

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint32_t __thiscall Cache::getTag(Cache *this,uint32_t addr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint in_ESI;
  Cache *in_RDI;
  uint32_t mask;
  uint32_t idBits;
  uint32_t offsetBits;
  
  uVar1 = log2i(in_RDI,(in_RDI->policy).blockSize);
  uVar2 = log2i(in_RDI,(in_RDI->policy).blockNum / (in_RDI->policy).associativity);
  return in_ESI >> ((char)uVar1 + (char)uVar2 & 0x1fU) &
         (1 << ((' ' - (char)uVar1) - (char)uVar2 & 0x1fU)) - 1U;
}

Assistant:

uint32_t Cache::getTag(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << (32 - offsetBits - idBits)) - 1;
  return (addr >> (offsetBits + idBits)) & mask;
}